

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

any __thiscall
peg::Action::TypeAdaptor_csv<std::pair<char32_t,_char32_t>_>::operator()
          (TypeAdaptor_csv<std::pair<char32_t,_char32_t>_> *this,SemanticValues *sv,any *param_2)

{
  function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> fStack_38;
  
  std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>::function
            (&fStack_38,(function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> *)sv)
  ;
  call<std::pair<char32_t,_char32_t>,_std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>,_nullptr,_peg::SemanticValues_&>
            ((peg *)this,&fStack_38,(SemanticValues *)param_2);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return (any)(placeholder *)this;
}

Assistant:

any operator()(SemanticValues& sv, any& /*dt*/) {
            return call<R>(fn_, sv);
        }